

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__10,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  AlphaNum *in_R8;
  AlphaNum local_a8;
  AlphaNum local_78;
  string_view local_48 [3];
  
  local_48[0] = NullSafeStringView("Value must be identifier for boolean option \"");
  local_78.piece_._M_len = (size_t)*(ushort *)(*(long *)(**(long **)this + 8) + 2);
  local_78.piece_._M_str = (char *)(~local_78.piece_._M_len + *(long *)(**(long **)this + 8));
  local_a8.piece_ = NullSafeStringView("\".");
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)local_48,&local_78,&local_a8,in_R8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}